

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Design.cpp
# Opt level: O2

CBBox * __thiscall CDesign::GetStartBox(CBBox *__return_storage_ptr__,CDesign *this,int *pNumEdge)

{
  uint uVar1;
  uint uVar2;
  CLayer *this_00;
  uint uVar3;
  int iY;
  int i;
  int iVar4;
  uint uVar5;
  vector<int,_std::allocator<int>_> X;
  vector<int,_std::allocator<int>_> Y;
  CPoint PointE;
  CPoint PointS;
  
  X.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  X.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  X.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  Y.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  Y.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  Y.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  iVar4 = 1;
  while( true ) {
    if ((int)(this->super_CBBox).m_cMaxZ - (int)(this->super_CBBox).m_cMinZ < iVar4) break;
    this_00 = GetLayer(this,iVar4);
    CLayer::GetStartBox(this_00,&X,&Y);
    iVar4 = iVar4 + 1;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (X.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,X.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::
  __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (Y.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,Y.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if ((long)X.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)X.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      == 0) {
    uVar1 = ((int)(this->super_CBBox).m_iMaxX - (int)(this->super_CBBox).m_iMinX) / 2;
  }
  else {
    uVar1 = *(uint *)((long)X.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start +
                     ((long)X.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)X.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 1 & 0xfffffffffffffffcU));
  }
  if ((long)Y.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)Y.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      == 0) {
    uVar2 = ((int)(this->super_CBBox).m_iMaxY - (int)(this->super_CBBox).m_iMinY) / 2;
  }
  else {
    uVar2 = *(uint *)((long)Y.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start +
                     ((long)Y.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)Y.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 1 & 0xfffffffffffffffcU));
  }
  CObject::Display(0,"(%d,%d) predicted as the most congestion region\n",(ulong)uVar1);
  CPoint::CPoint(&PointS);
  CPoint::CPoint(&PointE);
  uVar5 = 1;
  if (1 < (int)uVar1) {
    uVar5 = uVar1;
  }
  uVar3 = 1;
  if (1 < (int)uVar2) {
    uVar3 = uVar2;
  }
  CPoint::SetXYZ(&PointS,uVar5 - 1,uVar3 - 1,0);
  iVar4 = this->m_iSizeX + -1;
  if ((int)(uVar1 + 1) < this->m_iSizeX) {
    iVar4 = uVar1 + 1;
  }
  iY = this->m_iSizeY + -1;
  if ((int)(uVar2 + 1) < this->m_iSizeY) {
    iY = uVar2 + 1;
  }
  CPoint::SetXYZ(&PointE,iVar4,iY,
                 (int)(this->super_CBBox).m_cMaxZ - (int)(this->super_CBBox).m_cMinZ);
  CBBox::CBBox(__return_storage_ptr__);
  CBBox::Initialize(__return_storage_ptr__,&PointS,&PointE);
  if (pNumEdge != (int *)0x0) {
    *pNumEdge = (int)((ulong)((long)X.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)X.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 2);
  }
  CPoint::~CPoint(&PointE);
  CPoint::~CPoint(&PointS);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&Y.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&X.super__Vector_base<int,_std::allocator<int>_>);
  return __return_storage_ptr__;
}

Assistant:

CBBox CDesign::GetStartBox(int* pNumEdge)
{
	//!compute the starting point of box expansion, based on the # of pins.
	//!it also can be done any congestion analysis.

	vector<int>	X;
	vector<int>	Y;

	for(int i=LAYER_METAL1;i<=T();++i)	GetLayer(i)->GetStartBox(&X,&Y);


	sort(X.begin(),X.end());
	sort(Y.begin(),Y.end());

	int	iStartX		=	X.size()? X[X.size()/2]:W()/2;
	int	iStartY		=	Y.size()? Y[Y.size()/2]:H()/2;

	Display(DISPLAY_MODE_INFO,"(%d,%d) predicted as the most congestion region\n",iStartX,iStartY);

	CPoint	PointS;
	CPoint	PointE;

	PointS.SetXYZ(MAX(0,iStartX-1),MAX(0,iStartY-1),0);
	PointE.SetXYZ(MIN(m_iSizeX-1,iStartX+1),MIN(m_iSizeY-1,iStartY+1),T());

	CBBox	BBox;

	BBox.Initialize(&PointS,&PointE);

	if(pNumEdge)	*pNumEdge = X.size();
	return	BBox;
}